

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

lyd_node *
lys_getnext_data(lyd_node *last,lyd_node *sibling,lysc_node **slast,lysc_node *parent,
                lysc_module *module)

{
  lyd_node *plVar1;
  bool bVar2;
  LY_ERR LVar3;
  lysc_node *last_00;
  lyd_node *match;
  lyd_node *local_38;
  
  local_38 = (lyd_node *)0x0;
  if (parent == (lysc_node *)0x0 && module == (lysc_module *)0x0) {
    __assert_fail("parent || module",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0xa8,
                  "struct lyd_node *lys_getnext_data(const struct lyd_node *, const struct lyd_node *, const struct lysc_node **, const struct lysc_node *, const struct lysc_module *)"
                 );
  }
  if (last == (lyd_node *)0x0) {
    if (slast == (lysc_node **)0x0) {
      bVar2 = true;
      last_00 = (lysc_node *)0x0;
      goto LAB_00125801;
    }
    last_00 = *slast;
  }
  else {
    if ((slast == (lysc_node **)0x0) || (last_00 = *slast, last_00 == (lysc_node *)0x0)) {
      __assert_fail("!last || (slast && *slast)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0xa9,
                    "struct lyd_node *lys_getnext_data(const struct lyd_node *, const struct lyd_node *, const struct lysc_node **, const struct lysc_node *, const struct lysc_module *)"
                   );
    }
    plVar1 = last->next;
    if ((plVar1 != (lyd_node *)0x0) && (plVar1->schema == last_00)) {
      return plVar1;
    }
  }
  bVar2 = false;
LAB_00125801:
  do {
    last_00 = lys_getnext(last_00,parent,module,0);
    if (last_00 == (lysc_node *)0x0) break;
    LVar3 = lyd_find_sibling_val(sibling,last_00,(char *)0x0,0,&local_38);
  } while (LVar3 != LY_SUCCESS);
  if (!bVar2) {
    *slast = last_00;
  }
  return local_38;
}

Assistant:

struct lyd_node *
lys_getnext_data(const struct lyd_node *last, const struct lyd_node *sibling, const struct lysc_node **slast,
        const struct lysc_node *parent, const struct lysc_module *module)
{
    const struct lysc_node *siter = NULL;
    struct lyd_node *match = NULL;

    assert(parent || module);
    assert(!last || (slast && *slast));

    if (slast) {
        siter = *slast;
    }

    if (last && last->next && (last->next->schema == siter)) {
        /* return next data instance */
        return last->next;
    }

    /* find next schema node data instance */
    while ((siter = lys_getnext(siter, parent, module, 0))) {
        if (!lyd_find_sibling_val(sibling, siter, NULL, 0, &match)) {
            break;
        }
    }

    if (slast) {
        *slast = siter;
    }
    return match;
}